

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void trace_hotside(jit_State *J,BCIns *pc)

{
  byte bVar1;
  BCIns *pc_00;
  jit_State *in_RSI;
  long in_RDI;
  SnapShot *snap;
  
  pc_00 = (BCIns *)(*(long *)((ulong)*(uint *)(*(long *)(in_RDI + 0x170) +
                                              (ulong)*(uint *)(in_RDI + 0x9a8) * 4) + 0x20) +
                   (ulong)*(uint *)(in_RDI + 0x9ac) * 0xc);
  if (((((*(byte *)(in_RDI + -0x13f) & 0x60) == 0) &&
       (*(char *)((ulong)*(uint *)(*(long *)(*(long *)(in_RDI + 0x68) + 0x10) + -8) + 6) == '\0'))
      && (*(char *)((long)pc_00 + 0xb) != -1)) &&
     (bVar1 = *(char *)((long)pc_00 + 0xb) + 1, *(byte *)((long)pc_00 + 0xb) = bVar1,
     *(int *)(in_RDI + 0x660) <= (int)(uint)bVar1)) {
    *(undefined4 *)(in_RDI + 0xd4) = 0x12;
    lj_trace_ins(in_RSI,pc_00);
  }
  return;
}

Assistant:

static void trace_hotside(jit_State *J, const BCIns *pc)
{
  SnapShot *snap = &traceref(J, J->parent)->snap[J->exitno];
  if (!(J2G(J)->hookmask & (HOOK_GC|HOOK_VMEVENT)) &&
      isluafunc(curr_func(J->L)) &&
      snap->count != SNAPCOUNT_DONE &&
      ++snap->count >= J->param[JIT_P_hotexit]) {
    lj_assertJ(J->state == LJ_TRACE_IDLE, "hot side exit while recording");
    /* J->parent is non-zero for a side trace. */
    J->state = LJ_TRACE_START;
    lj_trace_ins(J, pc);
  }
}